

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O3

CTcPrsNode * __thiscall CTPNArglistBase::fold_constants(CTPNArglistBase *this,CTcPrsSymtab *symtab)

{
  CTPNArg *pCVar1;
  
  for (pCVar1 = this->list_; pCVar1 != (CTPNArg *)0x0;
      pCVar1 = (pCVar1->super_CTPNArgBase).next_arg_) {
    (*(pCVar1->super_CTPNArgBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase[0xf])
              (pCVar1,symtab);
  }
  return &this->super_CTcPrsNode;
}

Assistant:

CTcPrsNode *CTPNArglistBase::fold_constants(CTcPrsSymtab *symtab)
{
    /* fold each list element */
    CTPNArg *cur;
    for (cur = get_arg_list_head() ; cur != 0 ; cur = cur->get_next_arg())
        cur->fold_constants(symtab);

    /* return myself with no further folding */
    return this;
}